

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  char cVar7;
  undefined8 uVar8;
  seqStore_t *psVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  int *piVar16;
  byte bVar17;
  uint uVar18;
  int *piVar19;
  int *piVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  int *piVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  BYTE *pBVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  int *piVar32;
  ZSTD_matchState_t *pZVar33;
  size_t offbaseFound;
  size_t local_d8;
  ZSTD_matchState_t *local_d0;
  uint local_c4;
  int *local_c0;
  int *local_b8;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  int *local_90;
  uint local_84;
  seqStore_t *local_80;
  int *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  int *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  pBVar2 = (ms->window).base;
  local_ac = (ms->cParams).minMatch;
  if (5 < local_ac) {
    local_ac = 6;
  }
  if (local_ac < 5) {
    local_ac = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_c4 = 6;
  if (local_94 < 6) {
    local_c4 = local_94;
  }
  uVar11 = (ms->window).dictLimit;
  local_a0 = (ulong)uVar11;
  if (local_c4 < 5) {
    local_c4 = 4;
  }
  local_68 = pBVar2 + local_a0;
  pZVar33 = ms->dictMatchState;
  local_60 = (pZVar33->window).base;
  local_40 = local_60 + (pZVar33->window).dictLimit;
  local_70 = (int *)(pZVar33->window).nextSrc;
  uVar10 = ((int)src - ((int)local_40 + (int)local_68)) + (int)local_70;
  piVar32 = (int *)((long)src + (ulong)(uVar10 == 0));
  uVar12 = *rep;
  local_d0 = ms;
  if (uVar10 < uVar12) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar18 = rep[1];
  local_b0 = uVar18;
  local_48 = rep;
  if (uVar10 < uVar18) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_90 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar10 = ms->nextToUpdate;
  uVar13 = (ulong)uVar10;
  uVar24 = ((int)local_90 - (int)(pBVar2 + uVar13)) + 1;
  uVar28 = 8;
  if (uVar24 < 8) {
    uVar28 = uVar24;
  }
  if (local_90 < pBVar2 + uVar13) {
    uVar28 = 0;
  }
  bVar17 = (byte)local_c4;
  local_c0 = (int *)src;
  local_80 = seqStore;
  if (uVar10 < uVar28 + uVar10) {
    local_78 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_0016bf1f:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar27 = ms->tagTable;
    uVar15 = ms->hashSalt;
    cVar7 = (char)ms->rowHashLog;
    local_58 = (BYTE *)0xcf1bbcdcbf9b0000;
    do {
      if (local_ac == 5) {
        uVar29 = *(long *)(pBVar2 + uVar13) * -0x30e4432345000000;
LAB_0016b2ea:
        uVar24 = (uint)((uVar29 ^ uVar15) >> (0x38U - cVar7 & 0x3f));
      }
      else {
        if (local_ac == 6) {
          uVar29 = *(long *)(pBVar2 + uVar13) * -0x30e4432340650000;
          goto LAB_0016b2ea;
        }
        uVar24 = (*(int *)(pBVar2 + uVar13) * -0x61c8864f ^ (uint)uVar15) >> (0x18U - cVar7 & 0x1f);
      }
      uVar31 = (uVar24 >> 8) << (bVar17 & 0x1f);
      if (((ulong)(pUVar3 + uVar31) & 0x3f) != 0) {
LAB_0016be27:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar27 + uVar31) & ~(-1L << (bVar17 & 0x3f))) != 0) {
LAB_0016be08:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar13 & 7] = uVar24;
      uVar13 = uVar13 + 1;
    } while (uVar28 + uVar10 != uVar13);
  }
  local_78 = (int *)(srcSize + (long)src);
  if (piVar32 < local_90) {
    local_84 = ((int)local_60 - (int)local_70) + uVar11;
    local_58 = local_60 + -(ulong)local_84;
    local_50 = local_78 + -8;
    local_38 = ~(-1L << (bVar17 & 0x3f));
    do {
      piVar23 = local_78;
      local_b8 = (int *)((long)piVar32 + 1);
      iVar26 = (int)pBVar2;
      uVar11 = (((int)piVar32 - iVar26) - uVar12) + 1;
      piVar16 = (int *)(pBVar2 + uVar11);
      if (uVar11 < (uint)local_a0) {
        piVar16 = (int *)(local_60 + (uVar11 - local_84));
      }
      local_b0 = uVar18;
      if ((uVar11 - (uint)local_a0 < 0xfffffffd) && (*piVar16 == *local_b8)) {
        piVar19 = local_78;
        if (uVar11 < (uint)local_a0) {
          piVar19 = local_70;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar32 + 5),(BYTE *)(piVar16 + 1),(BYTE *)local_78,
                            (BYTE *)piVar19,local_68);
        uVar13 = sVar14 + 4;
      }
      else {
        uVar13 = 0;
      }
      local_d8 = 999999999;
      if (local_ac == 6) {
        if (local_c4 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
        else if (local_c4 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
      }
      else if (local_ac == 5) {
        if (local_c4 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
        else if (local_c4 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
        }
      }
      else if (local_c4 == 6) {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
      }
      else if (local_c4 == 5) {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
      }
      else {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (local_d0,(BYTE *)piVar32,(BYTE *)piVar23,&local_d8);
      }
      uVar29 = uVar13;
      if (uVar13 < uVar15) {
        uVar29 = uVar15;
      }
      if (uVar29 < 4) {
        uVar13 = (long)piVar32 - (long)local_c0;
        piVar32 = (int *)((long)piVar32 + (uVar13 >> 8) + 1);
        local_d0->lazySkipping = (uint)(0x7ff < uVar13);
        uVar18 = local_b0;
      }
      else {
        piVar16 = piVar32;
        local_a8 = local_d8;
        if (uVar15 <= uVar13) {
          local_a8 = 1;
          piVar16 = local_b8;
        }
        local_b8 = piVar16;
        if (piVar32 < local_90) {
          do {
            piVar16 = (int *)((long)piVar32 + 1);
            uVar11 = ((int)piVar16 - iVar26) - uVar12;
            piVar19 = (int *)(pBVar2 + uVar11);
            if (uVar11 < (uint)local_a0) {
              piVar19 = (int *)(local_60 + (uVar11 - local_84));
            }
            if ((uVar11 - (uint)local_a0 < 0xfffffffd) && (*piVar19 == *piVar16)) {
              piVar20 = piVar23;
              if (uVar11 < (uint)local_a0) {
                piVar20 = local_70;
              }
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar32 + 5),(BYTE *)(piVar19 + 1),(BYTE *)piVar23,
                                  (BYTE *)piVar20,local_68);
              if (sVar14 < 0xfffffffffffffffc) {
                uVar11 = 0x1f;
                if ((uint)local_a8 != 0) {
                  for (; (uint)local_a8 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 3 + -0x1e) < (int)(sVar14 + 4) * 3) {
                  local_a8 = 1;
                  uVar29 = sVar14 + 4;
                  local_b8 = piVar16;
                }
              }
            }
            local_d8 = 999999999;
            if (local_ac == 6) {
              if (local_c4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else if (local_c4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
            }
            else if (local_ac == 5) {
              if (local_c4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else if (local_c4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
            }
            else if (local_c4 == 6) {
              uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                 (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
            }
            else if (local_c4 == 5) {
              uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                 (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
            }
            else {
              uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                 (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
            }
            bVar6 = true;
            if (3 < uVar13) {
              uVar11 = 0x1f;
              if ((uint)local_a8 != 0) {
                for (; (uint)local_a8 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_d8 != 0) {
                for (; (uint)local_d8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 4 + -0x1b) < (int)uVar13 * 4 - iVar5) {
                bVar6 = false;
                local_a8 = local_d8;
                uVar29 = uVar13;
                local_b8 = piVar16;
              }
            }
            if (bVar6) {
              if (local_90 <= piVar16) break;
              piVar16 = (int *)((long)piVar32 + 2);
              uVar11 = ((int)piVar16 - iVar26) - uVar12;
              piVar19 = (int *)(pBVar2 + uVar11);
              if (uVar11 < (uint)local_a0) {
                piVar19 = (int *)(local_60 + (uVar11 - local_84));
              }
              if ((uVar11 - (uint)local_a0 < 0xfffffffd) && (*piVar19 == *piVar16)) {
                piVar20 = piVar23;
                if (uVar11 < (uint)local_a0) {
                  piVar20 = local_70;
                }
                sVar14 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar32 + 6),(BYTE *)(piVar19 + 1),
                                    (BYTE *)piVar23,(BYTE *)piVar20,local_68);
                if (sVar14 < 0xfffffffffffffffc) {
                  uVar11 = 0x1f;
                  if ((uint)local_a8 != 0) {
                    for (; (uint)local_a8 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                    }
                  }
                  if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 4 + -0x1e) < (int)(sVar14 + 4) * 4) {
                    local_a8 = 1;
                    uVar29 = sVar14 + 4;
                    local_b8 = piVar16;
                  }
                }
              }
              local_d8 = 999999999;
              if (local_ac == 6) {
                if (local_c4 == 6) {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
                else if (local_c4 == 5) {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
                else {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
              }
              else if (local_ac == 5) {
                if (local_c4 == 6) {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
                else if (local_c4 == 5) {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
                else {
                  uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                     (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
                }
              }
              else if (local_c4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else if (local_c4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                   (local_d0,(BYTE *)piVar16,(BYTE *)piVar23,&local_d8);
              }
              bVar6 = true;
              if (3 < uVar13) {
                uVar11 = 0x1f;
                if ((uint)local_a8 != 0) {
                  for (; (uint)local_a8 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                iVar5 = 0x1f;
                if ((uint)local_d8 != 0) {
                  for (; (uint)local_d8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 4 + -0x18) < (int)uVar13 * 4 - iVar5) {
                  bVar6 = false;
                  local_a8 = local_d8;
                  uVar29 = uVar13;
                  local_b8 = piVar16;
                }
              }
              if (bVar6) break;
            }
            piVar32 = piVar16;
          } while (piVar32 < local_90);
        }
        pZVar33 = local_d0;
        uVar11 = uVar12;
        uVar18 = local_b0;
        if (3 < local_a8) {
          pBVar21 = (BYTE *)((long)local_b8 + (-(long)pBVar2 - local_a8) + -0xfffffffd);
          pBVar22 = pBVar2;
          pBVar27 = local_68;
          if ((uint)pBVar21 < (uint)local_a0) {
            pBVar22 = local_58;
            pBVar27 = local_40;
          }
          if ((local_c0 < local_b8) &&
             (uVar13 = (ulong)pBVar21 & 0xffffffff, pBVar27 < pBVar22 + uVar13)) {
            pBVar22 = pBVar22 + uVar13;
            do {
              piVar32 = (int *)((long)local_b8 + -1);
              pBVar22 = pBVar22 + -1;
              if ((*(BYTE *)piVar32 != *pBVar22) ||
                 (uVar29 = uVar29 + 1, local_b8 = piVar32, piVar32 <= local_c0)) break;
            } while (pBVar27 < pBVar22);
          }
          uVar11 = (int)local_a8 - 3;
          uVar18 = uVar12;
        }
        if (local_80->maxNbSeq <=
            (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3)) {
LAB_0016be46:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_80->maxNbLit) {
LAB_0016be65:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar13 = (long)local_b8 - (long)local_c0;
        pBVar27 = local_80->lit;
        if (local_80->litStart + local_80->maxNbLit < pBVar27 + uVar13) {
LAB_0016bec2:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < local_b8) {
LAB_0016bea3:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < local_b8) {
          ZSTD_safecopyLiterals(pBVar27,(BYTE *)local_c0,(BYTE *)local_b8,(BYTE *)local_50);
        }
        else {
          uVar8 = *(undefined8 *)(local_c0 + 2);
          *(undefined8 *)pBVar27 = *(undefined8 *)local_c0;
          *(undefined8 *)(pBVar27 + 8) = uVar8;
          if (0x10 < uVar13) {
            pBVar27 = local_80->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar27 + 0x10 + (-0x10 - (long)(local_c0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(local_c0 + 6);
            *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)(local_c0 + 4);
            *(undefined8 *)(pBVar27 + 0x18) = uVar8;
            if (0x20 < (long)uVar13) {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_c0 + lVar25 + 0x20);
                uVar8 = puVar1[1];
                pBVar22 = pBVar27 + lVar25 + 0x20;
                *(undefined8 *)pBVar22 = *puVar1;
                *(undefined8 *)(pBVar22 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_c0 + lVar25 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar22 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar22 + 0x18) = uVar8;
                lVar25 = lVar25 + 0x20;
              } while (pBVar22 + 0x20 < pBVar27 + uVar13);
            }
          }
        }
        psVar9 = local_80;
        local_80->lit = local_80->lit + uVar13;
        if (0xffff < uVar13) {
          if (local_80->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_literalLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)local_80->sequences - (long)local_80->sequencesStart) >> 3);
        }
        psVar4 = local_80->sequences;
        psVar4->litLength = (U16)uVar13;
        psVar4->offBase = (U32)local_a8;
        if (uVar29 < 3) {
LAB_0016be84:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar29 - 3) {
          if (local_80->longLengthType != ZSTD_llt_none) {
LAB_0016bee1:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_80->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar29 - 3);
        local_80->sequences = psVar4 + 1;
        if (pZVar33->lazySkipping != 0) {
          uVar12 = pZVar33->nextToUpdate;
          uVar13 = (ulong)uVar12;
          uVar10 = ((int)local_90 - (int)(pBVar2 + uVar13)) + 1;
          if (7 < uVar10) {
            uVar10 = 8;
          }
          if (local_90 < pBVar2 + uVar13) {
            uVar10 = 0;
          }
          if (uVar12 < uVar10 + uVar12) {
            if (0x20 < pZVar33->rowHashLog + 8) goto LAB_0016bf1f;
            pUVar3 = pZVar33->hashTable;
            pBVar27 = pZVar33->tagTable;
            uVar15 = pZVar33->hashSalt;
            cVar7 = (char)pZVar33->rowHashLog;
            do {
              if (local_ac == 5) {
                uVar30 = *(long *)(pBVar2 + uVar13) * -0x30e4432345000000;
LAB_0016bbd8:
                uVar28 = (uint)((uVar30 ^ uVar15) >> (0x38U - cVar7 & 0x3f));
              }
              else {
                if (local_ac == 6) {
                  uVar30 = *(long *)(pBVar2 + uVar13) * -0x30e4432340650000;
                  goto LAB_0016bbd8;
                }
                uVar28 = (*(int *)(pBVar2 + uVar13) * -0x61c8864f ^ (uint)uVar15) >>
                         (0x18U - cVar7 & 0x1f);
              }
              uVar24 = (uVar28 >> 8) << ((byte)local_c4 & 0x1f);
              if (((ulong)(pUVar3 + uVar24) & 0x3f) != 0) goto LAB_0016be27;
              if ((local_38 & (ulong)(pBVar27 + uVar24)) != 0) goto LAB_0016be08;
              local_d0->hashCache[(uint)uVar13 & 7] = uVar28;
              uVar13 = uVar13 + 1;
              pZVar33 = local_d0;
            } while (uVar10 + uVar12 != uVar13);
          }
          pZVar33->lazySkipping = 0;
        }
        piVar32 = (int *)((long)local_b8 + uVar29);
        local_c0 = piVar32;
        do {
          uVar12 = uVar11;
          if (local_90 < piVar32) break;
          uVar12 = ((int)piVar32 - iVar26) - uVar18;
          pBVar27 = pBVar2;
          if (uVar12 < (uint)local_a0) {
            pBVar27 = local_58;
          }
          if ((uVar12 - (uint)local_a0 < 0xfffffffd) && (*(int *)(pBVar27 + uVar12) == *piVar32)) {
            piVar23 = local_78;
            if (uVar12 < (uint)local_a0) {
              piVar23 = local_70;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(piVar32 + 1),(BYTE *)((long)(pBVar27 + uVar12) + 4),
                                (BYTE *)local_78,(BYTE *)piVar23,local_68);
            if (psVar9->maxNbSeq <=
                (ulong)((long)psVar9->sequences - (long)psVar9->sequencesStart >> 3))
            goto LAB_0016be46;
            if (0x20000 < psVar9->maxNbLit) goto LAB_0016be65;
            pBVar27 = psVar9->lit;
            if (psVar9->litStart + psVar9->maxNbLit < pBVar27) goto LAB_0016bec2;
            if (local_78 < local_c0) goto LAB_0016bea3;
            if (local_50 < local_c0) {
              ZSTD_safecopyLiterals(pBVar27,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)local_50);
            }
            else {
              uVar8 = *(undefined8 *)(local_c0 + 2);
              *(undefined8 *)pBVar27 = *(undefined8 *)local_c0;
              *(undefined8 *)(pBVar27 + 8) = uVar8;
            }
            psVar4 = psVar9->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar14 + 4 < 3) goto LAB_0016be84;
            if (0xffff < sVar14 + 1) {
              if (psVar9->longLengthType != ZSTD_llt_none) goto LAB_0016bee1;
              psVar9->longLengthType = ZSTD_llt_matchLength;
              psVar9->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar9->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar14 + 1);
            psVar9->sequences = psVar4 + 1;
            piVar32 = (int *)((long)piVar32 + sVar14 + 4);
            bVar6 = true;
            uVar12 = uVar11;
            uVar11 = uVar18;
            local_c0 = piVar32;
          }
          else {
            bVar6 = false;
            uVar12 = uVar18;
          }
          uVar18 = uVar12;
          uVar12 = uVar11;
        } while (bVar6);
      }
    } while (piVar32 < local_90);
  }
  *local_48 = uVar12;
  local_48[1] = uVar18;
  return (long)local_78 - (long)local_c0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
ZSTD_compressBlock_lazy_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth,
                        ZSTD_dictMode_e const dictMode)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = (searchMethod == search_rowHash) ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 prefixLowestIndex = ms->window.dictLimit;
    const BYTE* const prefixLowest = base + prefixLowestIndex;
    const U32 mls = BOUNDED(4, ms->cParams.minMatch, 6);
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);

    U32 offset_1 = rep[0], offset_2 = rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const int isDMS = dictMode == ZSTD_dictMatchState;
    const int isDDS = dictMode == ZSTD_dedicatedDictSearch;
    const int isDxS = isDMS || isDDS;
    const ZSTD_matchState_t* const dms = ms->dictMatchState;
    const U32 dictLowestIndex      = isDxS ? dms->window.dictLimit : 0;
    const BYTE* const dictBase     = isDxS ? dms->window.base : NULL;
    const BYTE* const dictLowest   = isDxS ? dictBase + dictLowestIndex : NULL;
    const BYTE* const dictEnd      = isDxS ? dms->window.nextSrc : NULL;
    const U32 dictIndexDelta       = isDxS ?
                                     prefixLowestIndex - (U32)(dictEnd - dictBase) :
                                     0;
    const U32 dictAndPrefixLength = (U32)((ip - prefixLowest) + (dictEnd - dictLowest));

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_generic (dictMode=%u) (searchFunc=%u)", (U32)dictMode, (U32)searchMethod);
    ip += (dictAndPrefixLength == 0);
    if (dictMode == ZSTD_noDict) {
        U32 const curr = (U32)(ip - base);
        U32 const windowLow = ZSTD_getLowestPrefixIndex(ms, curr, ms->cParams.windowLog);
        U32 const maxRep = curr - windowLow;
        if (offset_2 > maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 > maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }
    if (isDxS) {
        /* dictMatchState repCode checks don't currently handle repCode == 0
         * disabling. */
        assert(offset_1 <= dictAndPrefixLength);
        assert(offset_2 <= dictAndPrefixLength);
    }

    /* Reset the lazy skipping state */
    ms->lazySkipping = 0;

    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offBase = REPCODE1_TO_OFFBASE;
        const BYTE* start=ip+1;
        DEBUGLOG(7, "search baseline (depth 0)");

        /* check repCode */
        if (isDxS) {
            const U32 repIndex = (U32)(ip - base) + 1 - offset_1;
            const BYTE* repMatch = ((dictMode == ZSTD_dictMatchState || dictMode == ZSTD_dedicatedDictSearch)
                                && repIndex < prefixLowestIndex) ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
            if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
                const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                if (depth==0) goto _storeSequence;
            }
        }
        if ( dictMode == ZSTD_noDict
          && ((offset_1 > 0) & (MEM_read32(ip+1-offset_1) == MEM_read32(ip+1)))) {
            matchLength = ZSTD_count(ip+1+4, ip+1+4-offset_1, iend) + 4;
            if (depth==0) goto _storeSequence;
        }

        /* first search (depth 0) */
        {   size_t offbaseFound = 999999999;
            size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &offbaseFound, mls, rowLog, searchMethod, dictMode);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offBase = offbaseFound;
        }

        if (matchLength < 4) {
            size_t const step = ((size_t)(ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */;
            ip += step;
            /* Enter the lazy skipping mode once we are skipping more than 8 bytes at a time.
             * In this mode we stop inserting every position into our tables, and only insert
             * positions that we search, which is one in step positions.
             * The exact cutoff is flexible, I've just chosen a number that is reasonably high,
             * so we minimize the compression ratio loss in "normal" scenarios. This mode gets
             * triggered once we've gone 2KB without finding any matches.
             */
            ms->lazySkipping = step > kLazySkippingStep;
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            DEBUGLOG(7, "search depth 1");
            ip ++;
            if ( (dictMode == ZSTD_noDict)
              && (offBase) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                int const gain2 = (int)(mlRep * 3);
                int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offBase) + 1);
                if ((mlRep >= 4) && (gain2 > gain1))
                    matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
            }
            if (isDxS) {
                const U32 repIndex = (U32)(ip - base) - offset_1;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                               dictBase + (repIndex - dictIndexDelta) :
                               base + repIndex;
                if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                    && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                    size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                    int const gain2 = (int)(mlRep * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offBase) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                }
            }
            {   size_t ofbCandidate=999999999;
                size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, dictMode);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offBase = ofbCandidate, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                DEBUGLOG(7, "search depth 2");
                ip ++;
                if ( (dictMode == ZSTD_noDict)
                  && (offBase) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                    size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                    int const gain2 = (int)(mlRep * 4);
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                }
                if (isDxS) {
                    const U32 repIndex = (U32)(ip - base) - offset_1;
                    const BYTE* repMatch = repIndex < prefixLowestIndex ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
                    if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                        && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                        const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                        size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                        int const gain2 = (int)(mlRep * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 1);
                        if ((mlRep >= 4) && (gain2 > gain1))
                            matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                    }
                }
                {   size_t ofbCandidate=999999999;
                    size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, dictMode);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offBase = ofbCandidate, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* NOTE:
         * Pay attention that `start[-value]` can lead to strange undefined behavior
         * notably if `value` is unsigned, resulting in a large positive `-value`.
         */
        /* catch up */
        if (OFFBASE_IS_OFFSET(offBase)) {
            if (dictMode == ZSTD_noDict) {
                while ( ((start > anchor) & (start - OFFBASE_TO_OFFSET(offBase) > prefixLowest))
                     && (start[-1] == (start-OFFBASE_TO_OFFSET(offBase))[-1]) )  /* only search for offset within prefix */
                    { start--; matchLength++; }
            }
            if (isDxS) {
                U32 const matchIndex = (U32)((size_t)(start-base) - OFFBASE_TO_OFFSET(offBase));
                const BYTE* match = (matchIndex < prefixLowestIndex) ? dictBase + matchIndex - dictIndexDelta : base + matchIndex;
                const BYTE* const mStart = (matchIndex < prefixLowestIndex) ? dictLowest : prefixLowest;
                while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            }
            offset_2 = offset_1; offset_1 = (U32)OFFBASE_TO_OFFSET(offBase);
        }
        /* store sequence */
_storeSequence:
        {   size_t const litLength = (size_t)(start - anchor);
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offBase, matchLength);
            anchor = ip = start + matchLength;
        }
        if (ms->lazySkipping) {
            /* We've found a match, disable lazy skipping mode, and refill the hash cache. */
            if (searchMethod == search_rowHash) {
                ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
            }
            ms->lazySkipping = 0;
        }

        /* check immediate repcode */
        if (isDxS) {
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex = current2 - offset_2;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                        dictBase - dictIndexDelta + repIndex :
                        base + repIndex;
                if ( ((U32)((prefixLowestIndex-1) - (U32)repIndex) >= 3 /* intentional overflow */)
                   && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex < prefixLowestIndex ? dictEnd : iend;
                    matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd2, prefixLowest) + 4;
                    offBase = offset_2; offset_2 = offset_1; offset_1 = (U32)offBase;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, matchLength);
                    ip += matchLength;
                    anchor = ip;
                    continue;
                }
                break;
            }
        }

        if (dictMode == ZSTD_noDict) {
            while ( ((ip <= ilimit) & (offset_2>0))
                 && (MEM_read32(ip) == MEM_read32(ip - offset_2)) ) {
                /* store sequence */
                matchLength = ZSTD_count(ip+4, ip+4-offset_2, iend) + 4;
                offBase = offset_2; offset_2 = offset_1; offset_1 = (U32)offBase; /* swap repcodes */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, matchLength);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
    }   }   }

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}